

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gemm_x86_avx.cpp
# Opt level: O2

int __thiscall ncnn::Gemm_x86_avx::create_pipeline(Gemm_x86_avx *this,Option *opt)

{
  Mat *pMVar1;
  Mat *dst;
  Allocator *pAVar2;
  void *pvVar3;
  int max_kk;
  int iVar4;
  uint uVar5;
  ulong uVar6;
  int *piVar7;
  int iVar8;
  int iVar9;
  int max_ii;
  int iVar10;
  int iVar11;
  int iVar12;
  int iVar13;
  ulong uVar14;
  int iVar15;
  Mat local_a8;
  int local_58;
  int TILE_K;
  int TILE_N;
  int TILE_M;
  Option *local_48;
  ulong local_40;
  ulong local_38;
  
  if ((this->super_Gemm).int8_scale_term != 0) {
    iVar4 = create_pipeline_int8(this,opt);
    return iVar4;
  }
  local_48 = opt;
  if ((this->super_Gemm).constantA == 0) {
LAB_004758d7:
    if ((this->super_Gemm).constantB != 0) {
      iVar4 = (this->super_Gemm).constantN;
      iVar10 = (this->super_Gemm).constantK;
      get_optimal_tile_mnk
                (0,iVar4,iVar10,(this->super_Gemm).constant_TILE_M,
                 (this->super_Gemm).constant_TILE_N,(this->super_Gemm).constant_TILE_K,&TILE_M,
                 &TILE_N,&TILE_K,opt->num_threads);
      iVar11 = (TILE_N + iVar4 + -1) / TILE_N;
      iVar8 = (iVar10 + TILE_K + -1) / TILE_K;
      Mat::create(&this->BT_data,TILE_K * TILE_N,iVar8,iVar11,4,(Allocator *)0x0);
      if (((this->BT_data).data == (void *)0x0) ||
         ((long)(this->BT_data).c * (this->BT_data).cstep == 0)) goto LAB_00475ab1;
      iVar11 = iVar11 * iVar8;
      pMVar1 = &(this->super_Gemm).B_data;
      iVar13 = 0;
      if (iVar11 < 1) {
        iVar11 = 0;
      }
      for (; opt = local_48, iVar11 != iVar13; iVar13 = iVar13 + 1) {
        iVar9 = TILE_N * (iVar13 / iVar8);
        iVar12 = TILE_K * (int)((long)iVar13 % (long)iVar8);
        iVar15 = iVar4 - iVar9;
        if (TILE_N < iVar4 - iVar9) {
          iVar15 = TILE_N;
        }
        max_kk = iVar10 - iVar12;
        if (TILE_K < iVar10 - iVar12) {
          max_kk = TILE_K;
        }
        local_a8.w = (this->BT_data).w;
        local_a8.cstep = (size_t)local_a8.w;
        local_a8.elemsize = (this->BT_data).elemsize;
        local_a8.elempack = (this->BT_data).elempack;
        local_a8.data =
             (void *)((long)(this->BT_data).data +
                     ((long)iVar13 % (long)iVar8 & 0xffffffffU) * local_a8.cstep * local_a8.elemsize
                     + (long)(iVar13 / iVar8) * (this->BT_data).cstep * local_a8.elemsize);
        local_a8.allocator = (this->BT_data).allocator;
        local_a8.refcount._0_4_ = 0;
        local_a8.refcount._4_4_ = 0;
        local_a8.dims = 2;
        local_a8.h = 1;
        local_a8.d = 1;
        local_a8.c = 1;
        if ((this->super_Gemm).transB == 0) {
          transpose_pack_B_tile(pMVar1,&local_a8,iVar9,iVar15,iVar12,max_kk);
        }
        else {
          pack_B_tile(pMVar1,&local_a8,iVar9,iVar15,iVar12,max_kk);
        }
      }
      if (local_48->lightmode != false) {
        piVar7 = (this->super_Gemm).B_data.refcount;
        if (piVar7 != (int *)0x0) {
          LOCK();
          *piVar7 = *piVar7 + -1;
          UNLOCK();
          if (*piVar7 == 0) {
            pAVar2 = (this->super_Gemm).B_data.allocator;
            if (pAVar2 == (Allocator *)0x0) {
              free((this->super_Gemm).B_data.data);
            }
            else {
              (*pAVar2->_vptr_Allocator[3])();
            }
          }
        }
        (this->super_Gemm).B_data.cstep = 0;
        *(undefined8 *)((long)&(this->super_Gemm).B_data.refcount + 4) = 0;
        *(undefined8 *)((long)&(this->super_Gemm).B_data.elemsize + 4) = 0;
        pMVar1->data = (void *)0x0;
        (this->super_Gemm).B_data.refcount = (int *)0x0;
        (this->super_Gemm).B_data.dims = 0;
        (this->super_Gemm).B_data.w = 0;
        (this->super_Gemm).B_data.h = 0;
        (this->super_Gemm).B_data.d = 0;
        (this->super_Gemm).B_data.c = 0;
      }
    }
    if (((this->super_Gemm).constantC != 0) && ((this->super_Gemm).constant_broadcast_type_C != -1))
    {
      piVar7 = (this->super_Gemm).C_data.refcount;
      if (piVar7 != (int *)0x0) {
        LOCK();
        *piVar7 = *piVar7 + 1;
        UNLOCK();
      }
      piVar7 = (this->CT_data).refcount;
      if (piVar7 != (int *)0x0) {
        LOCK();
        *piVar7 = *piVar7 + -1;
        UNLOCK();
        if (*piVar7 == 0) {
          pAVar2 = (this->CT_data).allocator;
          if (pAVar2 == (Allocator *)0x0) {
            free((this->CT_data).data);
          }
          else {
            (*pAVar2->_vptr_Allocator[3])();
          }
        }
      }
      pMVar1 = &(this->super_Gemm).C_data;
      dst = &this->CT_data;
      piVar7 = (this->super_Gemm).C_data.refcount;
      (this->CT_data).data = (this->super_Gemm).C_data.data;
      (this->CT_data).refcount = piVar7;
      (this->CT_data).elemsize = (this->super_Gemm).C_data.elemsize;
      (this->CT_data).elempack = (this->super_Gemm).C_data.elempack;
      (this->CT_data).allocator = (this->super_Gemm).C_data.allocator;
      iVar4 = (this->super_Gemm).C_data.w;
      iVar10 = (this->super_Gemm).C_data.h;
      iVar11 = (this->super_Gemm).C_data.d;
      (this->CT_data).dims = (this->super_Gemm).C_data.dims;
      (this->CT_data).w = iVar4;
      (this->CT_data).h = iVar10;
      (this->CT_data).d = iVar11;
      (this->CT_data).c = (this->super_Gemm).C_data.c;
      (this->CT_data).cstep = (this->super_Gemm).C_data.cstep;
      if (((this->super_Gemm).constant_broadcast_type_C == 3) && (opt->use_packing_layout == true))
      {
        uVar5 = (this->super_Gemm).constantM;
        iVar4 = 8;
        if ((uVar5 & 7) != 0) {
          iVar4 = (uint)((uVar5 & 3) == 0) * 3 + 1;
        }
        convert_packing(pMVar1,dst,iVar4,opt);
      }
      if ((this->super_Gemm).beta != 1.0) {
        local_a8.cstep = 0;
        local_a8.data = (void *)0x0;
        local_a8.refcount._0_4_ = 0;
        local_a8.refcount._4_4_ = 0;
        local_a8.elemsize = SUB128(ZEXT812(0),4);
        local_a8.elempack = 0;
        local_a8.allocator = (Allocator *)0x0;
        local_a8.dims = 0;
        local_a8.c = 0;
        uVar14 = 0;
        local_a8.w = local_a8.refcount._4_4_;
        local_a8._48_8_ = local_a8.elemsize;
        Mat::create_like(&local_a8,dst,(Allocator *)0x0);
        uVar5 = (this->CT_data).c * (int)(this->CT_data).cstep * (this->CT_data).elempack;
        pvVar3 = (this->CT_data).data;
        uVar6 = (ulong)uVar5;
        if ((int)uVar5 < 1) {
          uVar6 = uVar14;
        }
        for (; uVar6 != uVar14; uVar14 = uVar14 + 1) {
          *(float *)((long)local_a8.data + uVar14 * 4) =
               (this->super_Gemm).beta * *(float *)((long)pvVar3 + uVar14 * 4);
        }
        piVar7 = (int *)CONCAT44(local_a8.refcount._4_4_,local_a8.refcount._0_4_);
        if (dst != &local_a8) {
          if (piVar7 != (int *)0x0) {
            LOCK();
            *piVar7 = *piVar7 + 1;
            UNLOCK();
          }
          piVar7 = (this->CT_data).refcount;
          if (piVar7 != (int *)0x0) {
            LOCK();
            *piVar7 = *piVar7 + -1;
            UNLOCK();
            if (*piVar7 == 0) {
              pAVar2 = (this->CT_data).allocator;
              if (pAVar2 == (Allocator *)0x0) {
                free((this->CT_data).data);
              }
              else {
                (*pAVar2->_vptr_Allocator[3])();
              }
            }
          }
          piVar7 = (int *)CONCAT44(local_a8.refcount._4_4_,local_a8.refcount._0_4_);
          (this->CT_data).data = local_a8.data;
          (this->CT_data).refcount =
               (int *)CONCAT44(local_a8.refcount._4_4_,local_a8.refcount._0_4_);
          (this->CT_data).elemsize = local_a8.elemsize;
          (this->CT_data).elempack = local_a8.elempack;
          (this->CT_data).allocator = local_a8.allocator;
          (this->CT_data).dims = local_a8.dims;
          (this->CT_data).w = local_a8.w;
          (this->CT_data).h = local_a8.h;
          (this->CT_data).d = local_a8.d;
          (this->CT_data).c = local_a8.c;
          (this->CT_data).cstep = local_a8.cstep;
        }
        if (piVar7 != (int *)0x0) {
          LOCK();
          *piVar7 = *piVar7 + -1;
          UNLOCK();
          if (*piVar7 == 0) {
            if (local_a8.allocator == (Allocator *)0x0) {
              free(local_a8.data);
            }
            else {
              (*(local_a8.allocator)->_vptr_Allocator[3])();
            }
          }
        }
      }
      if (opt->lightmode == true) {
        piVar7 = (this->super_Gemm).C_data.refcount;
        if (piVar7 != (int *)0x0) {
          LOCK();
          *piVar7 = *piVar7 + -1;
          UNLOCK();
          if (*piVar7 == 0) {
            pAVar2 = (this->super_Gemm).C_data.allocator;
            if (pAVar2 == (Allocator *)0x0) {
              free((this->super_Gemm).C_data.data);
            }
            else {
              (*pAVar2->_vptr_Allocator[3])();
            }
          }
        }
        (this->super_Gemm).C_data.cstep = 0;
        *(undefined8 *)((long)&(this->super_Gemm).C_data.refcount + 4) = 0;
        *(undefined8 *)((long)&(this->super_Gemm).C_data.elemsize + 4) = 0;
        pMVar1->data = (void *)0x0;
        (this->super_Gemm).C_data.refcount = (int *)0x0;
        (this->super_Gemm).C_data.dims = 0;
        (this->super_Gemm).C_data.w = 0;
        (this->super_Gemm).C_data.h = 0;
        (this->super_Gemm).C_data.d = 0;
        (this->super_Gemm).C_data.c = 0;
      }
    }
    iVar4 = 0;
    if ((((this->super_Gemm).constantA != 0) || ((this->super_Gemm).constantB != 0)) ||
       ((this->super_Gemm).constantC != 0)) {
      *(int *)&(this->super_Gemm).field_0x244 = opt->num_threads;
    }
  }
  else {
    uVar5 = (this->super_Gemm).constantM;
    iVar4 = (this->super_Gemm).constantK;
    get_optimal_tile_mnk
              (uVar5,0,iVar4,(this->super_Gemm).constant_TILE_M,(this->super_Gemm).constant_TILE_N,
               (this->super_Gemm).constant_TILE_K,&TILE_M,&TILE_N,&TILE_K,opt->num_threads);
    iVar11 = TILE_K;
    local_40 = (ulong)(uint)TILE_M;
    iVar10 = (int)(uVar5 + TILE_M + -1) / TILE_M;
    local_38 = (ulong)uVar5;
    Mat::create(&this->AT_data,TILE_K * TILE_M,(TILE_K + iVar4 + -1) / TILE_K,iVar10,4,
                (Allocator *)0x0);
    if (((this->AT_data).data != (void *)0x0) &&
       ((long)(this->AT_data).c * (this->AT_data).cstep != 0)) {
      pMVar1 = &(this->super_Gemm).A_data;
      iVar8 = 0;
      local_58 = iVar10;
      if (iVar10 < 1) {
        local_58 = 0;
      }
      for (; opt = local_48, iVar8 != local_58; iVar8 = iVar8 + 1) {
        iVar13 = (int)local_40;
        iVar15 = iVar13 * iVar8;
        iVar10 = (int)local_38 - iVar15;
        if (iVar13 < iVar10) {
          iVar10 = iVar13;
        }
        iVar13 = iVar4;
        for (iVar9 = 0; iVar9 < iVar4; iVar9 = iVar9 + iVar11) {
          iVar12 = iVar13;
          if (iVar11 < iVar13) {
            iVar12 = iVar11;
          }
          local_a8.elemsize = (this->AT_data).elemsize;
          local_a8.w = (this->AT_data).w;
          local_a8.cstep = (size_t)local_a8.w;
          local_a8.elempack = (this->AT_data).elempack;
          local_a8.allocator = (this->AT_data).allocator;
          local_a8.data =
               (void *)((long)(this->AT_data).data +
                       local_a8.elemsize * local_a8.cstep * (long)(iVar9 / iVar11) +
                       (this->AT_data).cstep * (long)iVar8 * local_a8.elemsize);
          local_a8.refcount._0_4_ = 0;
          local_a8.refcount._4_4_ = 0;
          local_a8.dims = 2;
          local_a8.h = 1;
          local_a8.d = 1;
          local_a8.c = 1;
          if ((this->super_Gemm).transA == 0) {
            pack_A_tile(pMVar1,&local_a8,iVar15,iVar10,iVar9,iVar12);
          }
          else {
            transpose_pack_A_tile(pMVar1,&local_a8,iVar15,iVar10,iVar9,iVar12);
          }
          iVar13 = iVar13 - iVar11;
        }
      }
      if (local_48->lightmode != false) {
        piVar7 = (this->super_Gemm).A_data.refcount;
        if (piVar7 != (int *)0x0) {
          LOCK();
          *piVar7 = *piVar7 + -1;
          UNLOCK();
          if (*piVar7 == 0) {
            pAVar2 = (this->super_Gemm).A_data.allocator;
            if (pAVar2 == (Allocator *)0x0) {
              free((this->super_Gemm).A_data.data);
            }
            else {
              (*pAVar2->_vptr_Allocator[3])();
            }
          }
        }
        (this->super_Gemm).A_data.cstep = 0;
        *(undefined8 *)((long)&(this->super_Gemm).A_data.refcount + 4) = 0;
        *(undefined8 *)((long)&(this->super_Gemm).A_data.elemsize + 4) = 0;
        pMVar1->data = (void *)0x0;
        (this->super_Gemm).A_data.refcount = (int *)0x0;
        (this->super_Gemm).A_data.dims = 0;
        (this->super_Gemm).A_data.w = 0;
        (this->super_Gemm).A_data.h = 0;
        (this->super_Gemm).A_data.d = 0;
        (this->super_Gemm).A_data.c = 0;
      }
      goto LAB_004758d7;
    }
LAB_00475ab1:
    iVar4 = -100;
  }
  return iVar4;
}

Assistant:

int Gemm_x86_avx::create_pipeline(const Option& opt)
{
#if NCNN_INT8
    if (int8_scale_term)
    {
        return create_pipeline_int8(opt);
    }
#endif

    if (constantA)
    {
        const int M = constantM;
        const int K = constantK;

        int TILE_M, TILE_N, TILE_K;
        get_optimal_tile_mnk(M, 0, K, constant_TILE_M, constant_TILE_N, constant_TILE_K, TILE_M, TILE_N, TILE_K, opt.num_threads);

        const int nn_M = (M + TILE_M - 1) / TILE_M;

        AT_data.create(TILE_K * TILE_M, (K + TILE_K - 1) / TILE_K, (M + TILE_M - 1) / TILE_M, 4u, (Allocator*)0);
        if (AT_data.empty())
            return -100;

        #pragma omp parallel for num_threads(opt.num_threads)
        for (int ppj = 0; ppj < nn_M; ppj++)
        {
            const int i = ppj * TILE_M;

            for (int k = 0; k < K; k += TILE_K)
            {
                const int max_ii = std::min((M - i), TILE_M);
                const int max_kk = std::min((K - k), TILE_K);

                Mat AT_tile = AT_data.channel(i / TILE_M).row_range(k / TILE_K, 1);

                if (transA)
                {
                    transpose_pack_A_tile(A_data, AT_tile, i, max_ii, k, max_kk);
                }
                else
                {
                    pack_A_tile(A_data, AT_tile, i, max_ii, k, max_kk);
                }
            }
        }

        if (opt.lightmode)
            A_data.release();
    }

    if (constantB)
    {
        const int N = constantN;
        const int K = constantK;

        int TILE_M, TILE_N, TILE_K;
        get_optimal_tile_mnk(0, N, K, constant_TILE_M, constant_TILE_N, constant_TILE_K, TILE_M, TILE_N, TILE_K, opt.num_threads);

        const int nn_N = (N + TILE_N - 1) / TILE_N;
        const int nn_K = (K + TILE_K - 1) / TILE_K;

        BT_data.create(TILE_K * TILE_N, (K + TILE_K - 1) / TILE_K, (N + TILE_N - 1) / TILE_N, 4u, (Allocator*)0);
        if (BT_data.empty())
            return -100;

        const int nn_NK = nn_N * nn_K;

        #pragma omp parallel for num_threads(opt.num_threads)
        for (int ppjk = 0; ppjk < nn_NK; ppjk++)
        {
            const int ppj = ppjk / nn_K;
            const int ppk = ppjk % nn_K;

            const int j = ppj * TILE_N;
            const int k = ppk * TILE_K;

            const int max_jj = std::min((N - j), TILE_N);
            const int max_kk = std::min((K - k), TILE_K);

            Mat BT_tile = BT_data.channel(j / TILE_N).row_range(k / TILE_K, 1);

            if (transB)
            {
                pack_B_tile(B_data, BT_tile, j, max_jj, k, max_kk);
            }
            else
            {
                transpose_pack_B_tile(B_data, BT_tile, j, max_jj, k, max_kk);
            }
        }

        if (opt.lightmode)
            B_data.release();
    }

    if (constantC && constant_broadcast_type_C != -1)
    {
        CT_data = C_data;

#if __SSE2__
        if (constant_broadcast_type_C == 3 && opt.use_packing_layout)
        {
#if __AVX512F__
            int C_elempack = constantM % 16 == 0 ? 16 : constantM % 8 == 0 ? 8 : constantM % 4 == 0 ? 4 : 1;
#elif __AVX__
            int C_elempack = constantM % 8 == 0 ? 8 : constantM % 4 == 0 ? 4 : 1;
#else
            int C_elempack = constantM % 4 == 0 ? 4 : 1;
#endif
            convert_packing(C_data, CT_data, C_elempack, opt);
        }
#endif // __SSE2__

        // pre-multiply C with beta
        if (beta != 1.f)
        {
            Mat C2;
            C2.create_like(CT_data);

            const int size = CT_data.total() * CT_data.elempack;
            for (int i = 0; i < size; i++)
            {
                C2[i] = CT_data[i] * beta;
            }

            CT_data = C2;
        }

        if (opt.lightmode)
            C_data.release();
    }

    if (constantA || constantB || constantC)
    {
        nT = opt.num_threads;
    }

    return 0;
}